

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

void hprime_final(ssh_hash *h,uint length,void *vout)

{
  uint local_6c;
  undefined8 local_68;
  uint8_t hashbuf [64];
  uint8_t *out;
  void *vout_local;
  ssh_hash *psStack_10;
  uint length_local;
  ssh_hash *h_local;
  
  hashbuf._56_8_ = vout;
  vout_local._4_4_ = length;
  psStack_10 = h;
  while (0x40 < vout_local._4_4_) {
    ssh_hash_final(psStack_10,(uchar *)&local_68);
    *(undefined8 *)hashbuf._56_8_ = local_68;
    *(undefined8 *)(hashbuf._56_8_ + 8) = hashbuf._0_8_;
    *(undefined8 *)(hashbuf._56_8_ + 0x10) = hashbuf._8_8_;
    *(undefined8 *)(hashbuf._56_8_ + 0x18) = hashbuf._16_8_;
    hashbuf._56_8_ = hashbuf._56_8_ + 0x20;
    vout_local._4_4_ = vout_local._4_4_ - 0x20;
    local_6c = vout_local._4_4_;
    if (0x40 < vout_local._4_4_) {
      local_6c = 0x40;
    }
    psStack_10 = blake2b_new_general(local_6c);
    BinarySink_put_data(psStack_10->binarysink_,&local_68,0x40);
    smemclr(&local_68,0x40);
  }
  ssh_hash_final(psStack_10,(uchar *)hashbuf._56_8_);
  return;
}

Assistant:

static void hprime_final(ssh_hash *h, unsigned length, void *vout)
{
    uint8_t *out = (uint8_t *)vout;

    while (length > 64) {
        uint8_t hashbuf[64];
        ssh_hash_final(h, hashbuf);

        memcpy(out, hashbuf, 32);
        out += 32;
        length -= 32;

        h = blake2b_new_general(length > 64 ? 64 : length);
        put_data(h, hashbuf, 64);

        smemclr(hashbuf, sizeof(hashbuf));
    }

    ssh_hash_final(h, out);
}